

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O3

NodePtr __thiscall avro::makePrimitive(avro *this,string *t)

{
  int iVar1;
  NodePrimitive *p;
  element_type *extraout_RAX;
  shared_count extraout_RDX;
  NodePtr NVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)t);
  if (iVar1 == 0) {
    p = (NodePrimitive *)operator_new(0x18);
    (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_NULL;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)t);
    if (iVar1 == 0) {
      p = (NodePrimitive *)operator_new(0x18);
      (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_BOOL;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)t);
      if (iVar1 == 0) {
        p = (NodePrimitive *)operator_new(0x18);
        (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_INT;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)t);
        if (iVar1 == 0) {
          p = (NodePrimitive *)operator_new(0x18);
          (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_LONG;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)t);
          if (iVar1 == 0) {
            p = (NodePrimitive *)operator_new(0x18);
            (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_FLOAT;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)t);
            if (iVar1 == 0) {
              p = (NodePrimitive *)operator_new(0x18);
              (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_DOUBLE;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)t);
              if (iVar1 == 0) {
                p = (NodePrimitive *)operator_new(0x18);
                (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_STRING;
              }
              else {
                NVar2 = (NodePtr)std::__cxx11::string::compare((char *)t);
                if ((int)NVar2.px != 0) {
                  *(undefined8 *)this = 0;
                  *(undefined8 *)(this + 8) = 0;
                  return NVar2;
                }
                p = (NodePrimitive *)operator_new(0x18);
                (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_BYTES;
              }
            }
          }
        }
      }
    }
  }
  (p->super_NodeImplPrimitive).super_Node.locked_ = false;
  (p->super_NodeImplPrimitive).super_Node._vptr_Node = (_func_int **)&PTR__Node_001cdb28;
  boost::shared_ptr<avro::Node>::shared_ptr<avro::NodePrimitive>((shared_ptr<avro::Node> *)this,p);
  NVar2.pn.pi_ = extraout_RDX.pi_;
  NVar2.px = extraout_RAX;
  return NVar2;
}

Assistant:

static NodePtr makePrimitive(const std::string& t)
{
    if (t == "null") {
        return NodePtr(new NodePrimitive(AVRO_NULL));
    } else if (t == "boolean") {
        return NodePtr(new NodePrimitive(AVRO_BOOL));
    } else if (t == "int") {
        return NodePtr(new NodePrimitive(AVRO_INT));
    } else if (t == "long") {
        return NodePtr(new NodePrimitive(AVRO_LONG));
    } else if (t == "float") {
        return NodePtr(new NodePrimitive(AVRO_FLOAT));
    } else if (t == "double") {
        return NodePtr(new NodePrimitive(AVRO_DOUBLE));
    } else if (t == "string") {
        return NodePtr(new NodePrimitive(AVRO_STRING));
    } else if (t == "bytes") {
        return NodePtr(new NodePrimitive(AVRO_BYTES));
    } else {
        return NodePtr();
    }
}